

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

int onig_new(regex_t **reg,OnigUChar *pattern,OnigUChar *pattern_end,OnigOptionType option,
            OnigEncoding enc,OnigSyntaxType *syntax,OnigErrorInfo *einfo)

{
  regex_t *prVar1;
  int r;
  OnigSyntaxType *syntax_local;
  OnigEncoding enc_local;
  OnigOptionType option_local;
  OnigUChar *pattern_end_local;
  OnigUChar *pattern_local;
  regex_t **reg_local;
  
  prVar1 = (regex_t *)malloc(0x1c8);
  *reg = prVar1;
  if (*reg == (regex_t *)0x0) {
    reg_local._4_4_ = -5;
  }
  else {
    reg_local._4_4_ = onig_reg_init(*reg,option,OnigDefaultCaseFoldFlag,enc,syntax);
    if (reg_local._4_4_ == 0) {
      reg_local._4_4_ = onig_compile(*reg,pattern,pattern_end,einfo);
      if (reg_local._4_4_ != 0) {
        onig_free(*reg);
        *reg = (regex_t *)0x0;
      }
    }
    else {
      free(*reg);
      *reg = (regex_t *)0x0;
    }
  }
  return reg_local._4_4_;
}

Assistant:

extern int
onig_new(regex_t** reg, const UChar* pattern, const UChar* pattern_end,
         OnigOptionType option, OnigEncoding enc, OnigSyntaxType* syntax,
         OnigErrorInfo* einfo)
{
  int r;

  *reg = (regex_t* )xmalloc(sizeof(regex_t));
  if (IS_NULL(*reg)) return ONIGERR_MEMORY;

  r = onig_reg_init(*reg, option, ONIGENC_CASE_FOLD_DEFAULT, enc, syntax);
  if (r != 0) {
    xfree(*reg);
    *reg = NULL;
    return r;
  }

  r = onig_compile(*reg, pattern, pattern_end, einfo);
  if (r != 0) {
    onig_free(*reg);
    *reg = NULL;
  }
  return r;
}